

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Dim anon_unknown.dwarf_deef1e::TranslateDimensionality(TSampler *sampler)

{
  byte bVar1;
  
  bVar1 = sampler->field_0x1 - 1;
  if (bVar1 < 8) {
    return *(Dim *)(&DAT_00718140 + (ulong)bVar1 * 4);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x162,
                "spv::Dim (anonymous namespace)::TranslateDimensionality(const glslang::TSampler &)"
               );
}

Assistant:

spv::Dim TranslateDimensionality(const glslang::TSampler& sampler)
{
    switch (sampler.dim) {
    case glslang::Esd1D:      return spv::Dim1D;
    case glslang::Esd2D:      return spv::Dim2D;
    case glslang::Esd3D:      return spv::Dim3D;
    case glslang::EsdCube:    return spv::DimCube;
    case glslang::EsdRect:    return spv::DimRect;
    case glslang::EsdBuffer:  return spv::DimBuffer;
    case glslang::EsdSubpass: return spv::DimSubpassData;
    case glslang::EsdAttachmentEXT: return spv::DimTileImageDataEXT;
    default:
        assert(0);
        return spv::Dim2D;
    }
}